

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifLibBox.c
# Opt level: O2

If_LibBox_t * If_LibBoxRead2(char *pFileName)

{
  int iVar1;
  int Id;
  int nPis;
  int nPos;
  int iVar2;
  FILE *__stream;
  char *__s;
  char *pcVar3;
  char *pcVar4;
  If_LibBox_t *p;
  If_Box_t *pBox;
  ulong uVar5;
  ulong uVar6;
  int local_50;
  int local_4c;
  
  __stream = fopen(pFileName,"rb");
  if (__stream == (FILE *)0x0) {
    printf("Cannot open file \"%s\".\n",pFileName);
    return (If_LibBox_t *)0x0;
  }
  __s = (char *)malloc(100000);
  p = (If_LibBox_t *)0x0;
  pBox = (If_Box_t *)0x0;
  nPis = 0;
  nPos = 0;
  do {
    uVar5 = (ulong)(uint)(nPos * nPis);
    if (nPos * nPis < 1) {
      uVar5 = 0;
    }
    do {
      while( true ) {
        do {
          pcVar3 = fgets(__s,100000,__stream);
          if (pcVar3 == (char *)0x0) {
            free(__s);
            fclose(__stream);
            return p;
          }
          pcVar3 = strtok(__s," \n\r\t");
        } while (pcVar3 == (char *)0x0);
        if (*pcVar3 == '.') break;
        if (nPos < 1 || nPis < 1) {
          __assert_fail("nPis > 0 && nPos > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifLibBox.c"
                        ,0xe0,"If_LibBox_t *If_LibBoxRead2(char *)");
        }
        for (uVar6 = 0; uVar6 != uVar5; uVar6 = uVar6 + 1) {
          while (pcVar3 == (char *)0x0) {
            pcVar3 = fgets(__s,100000,__stream);
            if (pcVar3 == (char *)0x0) {
              puts("The table does not have enough entries.");
              fflush(_stdout);
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifLibBox.c"
                            ,0xe6,"If_LibBox_t *If_LibBoxRead2(char *)");
            }
            pcVar3 = strtok(__s," \n\r\t");
          }
          iVar1 = -1;
          if (*pcVar3 != '-') {
            iVar1 = atoi(pcVar3);
          }
          pBox->pDelays[uVar6] = iVar1;
          pcVar3 = strtok((char *)0x0," \n\r\t");
        }
        pBox = (If_Box_t *)0x0;
      }
      iVar1 = strcmp(pcVar3,".box");
    } while (iVar1 != 0);
    iVar1 = 0;
    pcVar3 = strtok((char *)0x0," \n\r\t");
    Id = atoi(pcVar3);
    pcVar3 = strtok((char *)0x0," \n\r\t");
    pcVar3 = Abc_UtilStrsav(pcVar3);
    pcVar4 = strtok((char *)0x0," \n\r\t");
    nPis = atoi(pcVar4);
    pcVar4 = strtok((char *)0x0," \n\r\t");
    nPos = atoi(pcVar4);
    local_4c = 0;
    local_50 = 0;
    while (pcVar4 = strtok((char *)0x0," \n\r\t"), pcVar4 != (char *)0x0) {
      iVar2 = strcmp(pcVar4,"seq");
      if (iVar2 == 0) {
        iVar1 = 1;
      }
      else {
        iVar2 = strcmp(pcVar4,"black");
        if (iVar2 == 0) {
          local_4c = 1;
        }
        else {
          iVar2 = strcmp(pcVar4,"outer");
          if (iVar2 == 0) {
            local_50 = 1;
          }
          else {
            iVar2 = strcmp(pcVar4,"comb");
            if (((iVar2 != 0) && (iVar2 = strcmp(pcVar4,"white"), iVar2 != 0)) &&
               (iVar2 = strcmp(pcVar4,"inner"), iVar2 != 0)) {
              __assert_fail("!strcmp(pToken, \"comb\") || !strcmp(pToken, \"white\") || !strcmp(pToken, \"inner\")"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifLibBox.c"
                            ,0xd3,"If_LibBox_t *If_LibBoxRead2(char *)");
            }
          }
        }
      }
    }
    if (p == (If_LibBox_t *)0x0) {
      p = If_LibBoxStart();
    }
    pBox = If_BoxStart(pcVar3,Id,nPis,nPos,iVar1,local_4c,local_50);
    If_LibBoxAdd(p,pBox);
  } while( true );
}

Assistant:

If_LibBox_t * If_LibBoxRead2( char * pFileName )
{
    int nSize = 100000;
    char * pBuffer;
    FILE * pFile;
    If_LibBox_t * p = NULL;
    If_Box_t * pBox = NULL;
    char * pToken, * pName;
    int fSeq, fBlack, fOuter;
    int i, Id, nPis, nPos;
    pFile = fopen( pFileName, "rb" );
    if ( pFile == NULL )
    {
        printf( "Cannot open file \"%s\".\n", pFileName );
        return NULL;
    }
    // read lines
    nPis = nPos = 0;
    pBuffer = ABC_ALLOC( char, nSize );
    while ( fgets( pBuffer, nSize, pFile ) )
    {
        pToken = strtok( pBuffer, " \n\r\t" );
        if ( pToken == NULL )
            continue;
        if ( pToken[0] == '.' )
        {
            if ( !strcmp(pToken, ".box") )
            {
                // save ID
                pToken = strtok( NULL, " \n\r\t" );
                Id     = atoi( pToken );
                // save name
                pToken = strtok( NULL, " \n\r\t" );
                pName  = Abc_UtilStrsav(pToken);
                // save PIs
                pToken = strtok( NULL, " \n\r\t" );
                nPis   = atoi( pToken );
                // save POs
                pToken = strtok( NULL, " \n\r\t" );
                nPos   = atoi( pToken );
                // save attributes
                fSeq = fBlack = fOuter = 0;
                pToken = strtok( NULL, " \n\r\t" );
                while ( pToken )
                {
                    if ( !strcmp(pToken, "seq") )
                        fSeq = 1;
                    else if ( !strcmp(pToken, "black") )
                        fBlack = 1;
                    else if ( !strcmp(pToken, "outer") )
                        fOuter = 1;
                    else assert( !strcmp(pToken, "comb") || !strcmp(pToken, "white") || !strcmp(pToken, "inner") );
                    pToken = strtok( NULL, " \n\r\t" );
                }
                // create library
                if ( p == NULL )
                    p = If_LibBoxStart();
                // create box
                pBox = If_BoxStart( pName, Id, nPis, nPos, fSeq, fBlack, fOuter );
                If_LibBoxAdd( p, pBox );
            }
            continue;
        }
        // read the table
        assert( nPis > 0 && nPos > 0 );
        for ( i = 0; i < nPis * nPos; i++ )
        {
            while ( pToken == NULL )
            {
                if ( fgets( pBuffer, nSize, pFile ) == NULL )
                { printf( "The table does not have enough entries.\n" ); fflush(stdout); assert( 0 ); }
                pToken = strtok( pBuffer, " \n\r\t" );
            }
            pBox->pDelays[i] = (pToken[0] == '-') ? -1 : atoi(pToken);
            pToken = strtok( NULL, " \n\r\t" );
        }
        pBox = NULL;
    }
    ABC_FREE( pBuffer );
    fclose( pFile );
    return p;
}